

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Float __thiscall pbrt::StratifiedSampler::Get1D(StratifiedSampler *this)

{
  int iVar1;
  uint64_t uVar2;
  float fVar3;
  
  uVar2 = MixBits((long)*(int *)(Options + 4) ^
                  (long)this->dimension << 0x10 ^
                  (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20 ^
                  (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30);
  this->dimension = this->dimension + 1;
  iVar1 = PermutationElement(this->sampleIndex,this->yPixelSamples * this->xPixelSamples,
                             (uint32_t)uVar2);
  if (this->jitter == true) {
    fVar3 = RNG::Uniform<float>(&this->rng);
  }
  else {
    fVar3 = 0.5;
  }
  return (fVar3 + (float)iVar1) / (float)(this->yPixelSamples * this->xPixelSamples);
}

Assistant:

PBRT_CPU_GPU
    Float Get1D() {
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ GetOptions().seed);
        ++dimension;

        int stratum = PermutationElement(sampleIndex, SamplesPerPixel(), hash);
        Float delta = jitter ? rng.Uniform<Float>() : 0.5f;
        return (stratum + delta) / SamplesPerPixel();
    }